

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  u32 uVar1;
  int n;
  sqlite3_vtab *psVar2;
  char *pcVar3;
  u8 *a;
  u32 uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  sqlite3_module **ppsVar12;
  u32 nData;
  sqlite3_module *psVar13;
  sqlite3_vtab *psVar14;
  long lVar15;
  int iOff;
  i64 iPos;
  int local_5c;
  i64 local_58;
  sqlite3_vtab *local_50;
  int local_44;
  Fts5Buffer *local_40;
  Fts5IndexIter *local_38;
  
  psVar14 = pCursor->pVtab;
  local_44 = 0;
  psVar13 = pCursor[2].pVtab[1].pModule;
  iVar11 = *(int *)&psVar13->xBestIndex;
  lVar15 = (long)iVar11;
  pCursor[10].pVtab = (sqlite3_vtab *)((long)&(pCursor[10].pVtab)->pModule + 1);
  iVar7 = psVar14[2].nRef;
  if (iVar7 == 0) {
    uVar10 = (ulong)*(int *)&pCursor[7].pVtab;
    iVar9 = *(int *)&pCursor[7].pVtab + 1;
    uVar5 = uVar10;
    if (iVar9 < iVar11) {
      iVar9 = iVar11;
    }
    do {
      if (lVar15 <= (long)(uVar5 + 1)) {
        *(int *)&pCursor[7].pVtab = iVar9;
        goto LAB_001b2a1e;
      }
      uVar8 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar8;
      lVar6 = uVar5 * 2;
      uVar5 = uVar5 + 1;
    } while (*(long *)(&(pCursor[9].pVtab)->nRef + lVar6) == 0);
    *(uint *)&pCursor[7].pVtab = uVar8;
    if ((int)uVar8 < iVar11) {
      if (*(int *)&pCursor[3].pVtab != 0) {
        return 0;
      }
      goto LAB_001b2a39;
    }
  }
  else if (iVar7 == 2) {
    iVar11 = *(int *)((long)&psVar13->xColumn + 4);
    psVar14 = pCursor[4].pVtab;
    do {
      if ((iVar11 != 1) &&
         (iVar7 = sqlite3Fts5PoslistNext64
                            (*(u8 **)&psVar14->nRef,*(int *)&psVar14->zErrMsg,(int *)(pCursor + 0xe)
                             ,(i64 *)(pCursor + 0xd)), iVar7 == 0)) {
        return 0;
      }
      pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
      *(undefined4 *)&pCursor[0xe].pVtab = 0;
      iVar7 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
      if (iVar7 != 0) break;
      iVar7 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
      if (iVar11 == 1) {
        return iVar7;
      }
      if (*(int *)&pCursor[3].pVtab != 0) {
        return iVar7;
      }
    } while (iVar7 == 0);
    *(undefined4 *)&pCursor[3].pVtab = 1;
    return iVar7;
  }
LAB_001b2a1e:
  psVar2 = pCursor[4].pVtab;
  if (*(char *)((long)&psVar2->zErrMsg + 4) == '\0') {
    pcVar3 = psVar2[(ulong)*(ushort *)(psVar2[3].zErrMsg + 4) * 5 + 7].zErrMsg;
    nData = *(int *)&psVar2[(ulong)*(ushort *)(psVar2[3].zErrMsg + 4) * 5 + 8].pModule - 1;
    uVar1 = *(u32 *)&pCursor[5].pVtab;
    if (-1 < (int)uVar1) {
      uVar4 = uVar1;
      if ((int)nData < (int)uVar1) {
        uVar4 = nData;
      }
      iVar7 = memcmp(pCursor[6].pVtab,pcVar3 + 1,(long)(int)uVar4);
      if ((iVar7 < 0) || ((int)uVar1 < (int)nData && iVar7 == 0)) {
        *(undefined4 *)&pCursor[3].pVtab = 1;
        return 0;
      }
    }
    *(undefined4 *)&pCursor[0xc].pVtab = 0;
    local_50 = psVar14;
    sqlite3Fts5BufferAppendBlob(&local_44,(Fts5Buffer *)(pCursor + 0xb),nData,(u8 *)(pcVar3 + 1));
    memset(pCursor[8].pVtab,0,lVar15 * 8);
    memset(pCursor[9].pVtab,0,lVar15 * 8);
    *(undefined4 *)&pCursor[7].pVtab = 0;
    if (local_44 != 0) {
      return local_44;
    }
    iVar7 = local_50[2].nRef;
    psVar14 = local_50;
    local_40 = (Fts5Buffer *)(pCursor + 0xb);
    do {
      iVar9 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4);
      local_58 = 0;
      local_5c = 0;
      local_38 = (Fts5IndexIter *)pCursor[4].pVtab;
      a = local_38->pData;
      n = local_38->nData;
      if (iVar7 == 0) {
        if (iVar9 == 0) {
          iVar7 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
          if (iVar7 == 0) {
            iVar7 = -1;
            do {
              iVar9 = (int)((ulong)local_58 >> 0x20);
              if (iVar7 != iVar9) {
                if (iVar11 <= iVar9) {
                  return 0x10b;
                }
                ppsVar12 = &(pCursor[9].pVtab)->pModule + (local_58 >> 0x20);
                *ppsVar12 = (sqlite3_module *)((long)&(*ppsVar12)->iVersion + 1);
                iVar7 = iVar9;
              }
              ppsVar12 = &(pCursor[8].pVtab)->pModule + (local_58 >> 0x20);
              *ppsVar12 = (sqlite3_module *)((long)&(*ppsVar12)->iVersion + 1);
              iVar9 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
            } while (iVar9 == 0);
          }
        }
        else {
          if (iVar9 != 2) goto LAB_001b2c1b;
          iVar7 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
          psVar14 = local_50;
          while (iVar7 == 0) {
            if (lVar15 <= local_58) {
              return 0x10b;
            }
            ppsVar12 = &(pCursor[9].pVtab)->pModule + local_58;
            *ppsVar12 = (sqlite3_module *)((long)&(*ppsVar12)->iVersion + 1);
            iVar7 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
          }
        }
      }
      else if (iVar7 == 1) {
        if ((iVar9 == 0) && (iVar7 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58), iVar7 == 0))
        {
          psVar14 = pCursor[8].pVtab;
          psVar13 = psVar14->pModule;
          do {
            psVar13 = (sqlite3_module *)((long)&psVar13->iVersion + 1);
            psVar14->pModule = psVar13;
            iVar7 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
          } while (iVar7 == 0);
        }
LAB_001b2c1b:
        (pCursor[9].pVtab)->pModule =
             (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
        psVar14 = local_50;
      }
      iVar9 = sqlite3Fts5IterNextScan(local_38);
      iVar7 = psVar14[2].nRef;
      if (iVar7 == 2) {
        if (iVar9 != 0) {
          return iVar9;
        }
        iVar7 = 2;
        goto LAB_001b2a2f;
      }
      if (iVar9 != 0) {
        return iVar9;
      }
      psVar2 = pCursor[4].pVtab;
      uVar8 = *(int *)&psVar2[(ulong)*(ushort *)(psVar2[3].zErrMsg + 4) * 5 + 8].pModule - 1;
      if ((uVar8 != *(uint *)&pCursor[0xc].pVtab) ||
         (((1 < *(int *)&psVar2[(ulong)*(ushort *)(psVar2[3].zErrMsg + 4) * 5 + 8].pModule &&
           (iVar9 = bcmp(psVar2[(ulong)*(ushort *)(psVar2[3].zErrMsg + 4) * 5 + 7].zErrMsg + 1,
                         local_40->p,(ulong)uVar8), iVar9 != 0)) ||
          (*(char *)((long)&psVar2->zErrMsg + 4) != '\0')))) goto LAB_001b2a2f;
    } while( true );
  }
  *(undefined4 *)&pCursor[3].pVtab = 1;
LAB_001b2a2f:
  if (iVar7 != 0 || *(int *)&pCursor[3].pVtab != 0) {
    return 0;
  }
LAB_001b2a39:
  iVar11 = *(int *)&pCursor[7].pVtab;
  if ((&(pCursor[9].pVtab)->pModule)[iVar11] == (sqlite3_module *)0x0) {
    ppsVar12 = &(pCursor[9].pVtab)->pModule + iVar11;
    do {
      ppsVar12 = ppsVar12 + 1;
      iVar11 = iVar11 + 1;
    } while (*ppsVar12 == (sqlite3_module *)0x0);
    *(int *)&pCursor[7].pVtab = iVar11;
    return 0;
  }
  return 0;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int rc = SQLITE_OK;
  int nCol = pCsr->pFts5->pConfig->nCol;

  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            if( eDetail==FTS5_DETAIL_FULL ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                pCsr->aCnt[0]++;
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n 
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm)) 
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    while( pCsr->aDoc[pCsr->iCol]==0 ) pCsr->iCol++;
    assert( pCsr->iCol<pCsr->pFts5->pConfig->nCol );
  }
  return rc;
}